

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O1

stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_> *
util::rpn_parse(stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>
                *__return_storage_ptr__,string *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  size_type sVar5;
  bool bVar6;
  string tok;
  string local_90;
  variant local_70;
  
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->c).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<util::variant,_std::allocator<util::variant>_>::_M_initialize_map
            ((_Deque_base<util::variant,_std::allocator<util::variant>_> *)__return_storage_ptr__,0)
  ;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  sVar5 = expr->_M_string_length;
  paVar1 = &local_70.val_string.field_2;
  do {
    if ((expr->_M_dataplus)._M_p[sVar5 - 1] == ' ') {
      if (local_90._M_string_length != 0) {
        uVar3 = local_90._M_string_length - 1;
        if (uVar3 != 0) {
          uVar4 = 1;
          do {
            cVar2 = local_90._M_dataplus._M_p[uVar4 - 1];
            local_90._M_dataplus._M_p[uVar4 - 1] = local_90._M_dataplus._M_p[uVar3];
            local_90._M_dataplus._M_p[uVar3] = cVar2;
            uVar3 = uVar3 - 1;
            bVar6 = uVar4 < uVar3;
            uVar4 = uVar4 + 1;
          } while (bVar6);
        }
        variant::variant(&local_70,&local_90);
        std::deque<util::variant,_std::allocator<util::variant>_>::emplace_back<util::variant>
                  (&__return_storage_ptr__->c,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.val_string._M_dataplus._M_p != paVar1) {
          operator_delete(local_70.val_string._M_dataplus._M_p,
                          local_70.val_string.field_2._M_allocated_capacity + 1);
        }
        local_90._M_string_length = 0;
        *local_90._M_dataplus._M_p = '\0';
      }
    }
    else {
      std::__cxx11::string::push_back((char)&local_90);
    }
    sVar5 = sVar5 - 1;
  } while (sVar5 != 0);
  if (local_90._M_string_length != 0) {
    uVar3 = local_90._M_string_length - 1;
    if (uVar3 != 0) {
      uVar4 = 1;
      do {
        cVar2 = local_90._M_dataplus._M_p[uVar4 - 1];
        local_90._M_dataplus._M_p[uVar4 - 1] = local_90._M_dataplus._M_p[uVar3];
        local_90._M_dataplus._M_p[uVar3] = cVar2;
        uVar3 = uVar3 - 1;
        bVar6 = uVar4 < uVar3;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
    variant::variant(&local_70,&local_90);
    std::deque<util::variant,_std::allocator<util::variant>_>::emplace_back<util::variant>
              (&__return_storage_ptr__->c,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.val_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_70.val_string._M_dataplus._M_p,
                      local_70.val_string.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::stack<util::variant> rpn_parse(std::string expr)
{
	std::stack<util::variant> stack;
	std::string tok;

	std::size_t i = expr.length() - 1;
	do
	{
		if (expr[i] != ' ')
		{
			tok += expr[i];
		}
		else if (!tok.empty())
		{
			rpn_parse_str_reverse(tok);
			stack.push(util::variant(tok));
			tok.clear();
		}
	} while (i-- != 0);

	if (!tok.empty())
	{
		rpn_parse_str_reverse(tok);
		stack.push(util::variant(tok));
	}

	return stack;
}